

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_level(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  int high;
  int low;
  char highc [4608];
  char lowc [4608];
  AREA_DATA_conflict *pArea;
  char *in_stack_ffffffffffffdbc8;
  undefined4 in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd4;
  char in_stack_ffffffffffffdbd8;
  undefined7 in_stack_ffffffffffffdbd9;
  char *in_stack_ffffffffffffdbe0;
  char local_1228 [4616];
  long local_20;
  char *local_18;
  bool local_1;
  
  local_20 = *(long *)(*(long *)(in_RDI + 0x80) + 0x6c60);
  local_18 = one_argument((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                          in_stack_ffffffffffffdbc8);
  local_18 = one_argument((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                          in_stack_ffffffffffffdbc8);
  if ((((local_1228[0] == '\0') || (in_stack_ffffffffffffdbd8 == '\0')) ||
      (bVar1 = is_number(in_stack_ffffffffffffdbc8), !bVar1)) ||
     (bVar1 = is_number(in_stack_ffffffffffffdbc8), !bVar1)) {
    send_to_char(in_stack_ffffffffffffdbe0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbd9,in_stack_ffffffffffffdbd8));
    local_1 = false;
  }
  else {
    iVar2 = atoi(local_1228);
    iVar3 = atoi(&stack0xffffffffffffdbd8);
    if ((iVar2 < 1) || (0x33 < iVar3)) {
      send_to_char(in_stack_ffffffffffffdbe0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbd9,in_stack_ffffffffffffdbd8));
      local_1 = false;
    }
    else {
      *(short *)(local_20 + 0x54) = (short)iVar2;
      *(short *)(local_20 + 0x56) = (short)iVar3;
      send_to_char(in_stack_ffffffffffffdbe0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbd9,in_stack_ffffffffffffdbd8));
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool aedit_level(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char lowc[MSL], highc[MSL];
	int low, high;

	EDIT_AREA(ch, pArea);

	argument = one_argument(argument, lowc);
	argument = one_argument(argument, highc);

	if (lowc[0] == '\0' || highc[0] == '\0' || !is_number(lowc) || !is_number(highc))
	{
		send_to_char("Syntax:  level [low] [high]\n\r", ch);
		return false;
	}

	low = atoi(lowc);
	high = atoi(highc);

	if (low < 1 || high > 51)
	{
		send_to_char("Level range is from 1 to 51.\n\r", ch);
		return false;
	}

	pArea->low_range = low;
	pArea->high_range = high;
	send_to_char("Level range set.\n\r", ch);
	return true;
}